

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord1.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord1::RectangularVolumeRecord1
          (RectangularVolumeRecord1 *this,KUINT8 Index,WorldCoordinates *CornerLocation,
          Vector *RectangleLength,EulerAngles *Orientation)

{
  EulerAngles *Orientation_local;
  Vector *RectangleLength_local;
  WorldCoordinates *CornerLocation_local;
  KUINT8 Index_local;
  RectangularVolumeRecord1 *this_local;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__RectangularVolumeRecord1_003326f0;
  WorldCoordinates::WorldCoordinates(&this->m_CornerLocation,CornerLocation);
  Vector::Vector(&this->m_RecLength,RectangleLength);
  EulerAngles::EulerAngles(&this->m_Ori,Orientation);
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x500000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x180;
  return;
}

Assistant:

RectangularVolumeRecord1::RectangularVolumeRecord1( KUINT8 Index, const WorldCoordinates & CornerLocation, const Vector & RectangleLength,
        const EulerAngles & Orientation ) :
    m_CornerLocation( CornerLocation ),
    m_RecLength( RectangleLength ),
    m_Ori( Orientation )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = RectangularVolumeRecord1Type;
    m_ui16Length = ( RECTANGLE_VOLUME_RECORD_1_SIZE - EnvironmentRecord::ENVIRONMENT_RECORD_SIZE ) * 8;
}